

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraph.cpp
# Opt level: O2

list<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
* __thiscall
DynamicGraph::getVirtualEdges_abi_cxx11_
          (list<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
           *__return_storage_ptr__,DynamicGraph *this)

{
  _Base_ptr p_Var1;
  
  (__return_storage_ptr__->
  super__List_base<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  )._M_impl._M_node._M_size = 0;
  for (p_Var1 = (this->virtualEdges)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->virtualEdges)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    std::__cxx11::
    list<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)(p_Var1 + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

std::list<Edge> DynamicGraph::getVirtualEdges() const
{
    std::list<Edge> virtualEdgesList;
    for (const auto &virtualEdge : this->virtualEdges) {
        virtualEdgesList.push_back(virtualEdge);
    }
    return virtualEdgesList;
}